

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.H
# Opt level: O1

double amrex::detail::bisect_prob_hi<double>(Real plo,Real phi,Real idx,int ilo,int ihi,Real tol)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_58;
  
  local_58 = phi - tol;
  dVar4 = floor((local_58 - plo) * idx);
  iVar2 = (int)dVar4;
  if (iVar2 < 0 || ihi < iVar2 + ilo) {
    dVar9 = phi + -0.5 / idx;
    dVar5 = floor((dVar9 - plo) * idx);
    dVar4 = -0.5;
    if (-1 < (int)dVar5) {
      dVar4 = *(double *)(&DAT_006a3bb0 + (ulong)((int)dVar5 + ilo <= ihi) * 8);
    }
    if ((dVar4 != 0.0) || (dVar5 = dVar4, NAN(dVar4))) {
      if (iVar2 < 0) {
        dVar5 = -0.5;
      }
      else {
        dVar5 = *(double *)(&DAT_006a3bb0 + (ulong)(iVar2 + ilo <= ihi) * 8);
      }
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        dVar6 = dVar9 + local_58;
        dVar5 = dVar6 * 0.5;
        if ((tol <= local_58 - dVar9) &&
           ((2.2250738585072014e-308 <= ABS(dVar9 - local_58) &&
            (ABS(dVar6) * 2.220446049250313e-16 + ABS(dVar6) * 2.220446049250313e-16 <
             ABS(dVar9 - local_58))))) {
          uVar1 = 1;
          while( true ) {
            dVar5 = dVar6 * 0.5;
            dVar6 = floor((dVar5 - plo) * idx);
            dVar7 = 0.5;
            if (ihi < (int)dVar6 + ilo) {
              dVar7 = -0.5;
            }
            dVar8 = -0.5;
            if (-1 < (int)dVar6) {
              dVar8 = dVar7;
            }
            if ((dVar8 == 0.0) && (!NAN(dVar8))) break;
            if (0.0 <= dVar4 * dVar8) {
              dVar9 = dVar5;
            }
            if ((99 < uVar1) ||
               (uVar3 = -(ulong)(dVar4 * dVar8 < 0.0),
               local_58 = (double)(~uVar3 & (ulong)local_58 | uVar3 & (ulong)dVar5),
               local_58 - dVar9 < tol)) break;
            dVar6 = floor((dVar9 - plo) * idx);
            dVar4 = -0.5;
            if (-1 < (int)dVar6) {
              dVar4 = *(double *)(&DAT_006a3bb0 + (ulong)((int)dVar6 + ilo <= ihi) * 8);
            }
            dVar6 = local_58 + dVar9;
            if ((ABS(dVar9 - local_58) < 2.2250738585072014e-308) ||
               (uVar1 = uVar1 + 1,
               ABS(dVar9 - local_58) <=
               ABS(dVar6) * 2.220446049250313e-16 + ABS(dVar6) * 2.220446049250313e-16)) break;
          }
        }
      }
    }
    local_58 = dVar5 - tol;
  }
  return local_58;
}

Assistant:

T bisect_prob_hi (amrex::Real plo, amrex::Real phi, amrex::Real idx, int ilo, int ihi, amrex::Real tol) {
            T hi = static_cast<T>(phi - tol);
            bool safe;
            {
                int i = int(Math::floor((hi - plo)*idx)) + ilo;
                safe = i >= ilo && i <= ihi;
            }
            if (safe) {
                return hi;
            } else {
                // bisect the point at which the cell no longer maps to inside the domain
                T lo = static_cast<T>(phi - 0.5_rt/idx);
                T mid = bisect(lo, hi,
                               [=] AMREX_GPU_HOST_DEVICE (T x) -> T
                                   {
                                       int i = int(Math::floor((x - plo)*idx)) + ilo;
                                       bool inside = i >= ilo && i <= ihi;
                                       return static_cast<T>(inside) - T(0.5);
                                   }, static_cast<T>(tol));
                return mid - static_cast<T>(tol);
            }
        }